

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int generator_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  generator_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvVar1 = segment->data;
  if (field == 3) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x1c);
  }
  else if (field == 10) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0xc);
  }
  else {
    if (field != 0xb) {
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 8);
  }
  return 1;
}

Assistant:

int generator_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct generator_segment_data *data = (struct generator_segment_data *)segment->data;
  
  switch(field){
  case MIXED_VOLUME:
    *((float *)value) = data->volume;
    break;
  case MIXED_GENERATOR_FREQUENCY:
    *((float *)value) = data->frequency;
    break;
  case MIXED_GENERATOR_TYPE:
    *((enum mixed_generator_type *)value) = data->type;
    break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}